

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int InjectFlushOrPushOutput
              (BrotliEncoderState *s,size_t *available_out,uint8_t **next_out,size_t *total_out)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  anon_union_16_2_c961180f_for_tiny_buf_ *paVar5;
  ulong __n;
  size_t sVar6;
  
  if ((s->stream_state_ == BROTLI_STREAM_FLUSH_REQUESTED) &&
     (bVar1 = s->last_byte_bits_, bVar1 != 0)) {
    bVar2 = s->last_byte_;
    s->last_byte_ = '\0';
    s->last_byte_bits_ = '\0';
    iVar4 = 6 << (bVar1 & 0x1f);
    if (s->next_out_ == (uint8_t *)0x0) {
      paVar5 = &s->tiny_buf_;
      s->next_out_ = (uint8_t *)paVar5;
    }
    else {
      paVar5 = (anon_union_16_2_c961180f_for_tiny_buf_ *)(s->next_out_ + s->available_out_);
    }
    paVar5->u8[0] = bVar2 | (byte)iVar4;
    if (2 < bVar1) {
      paVar5->u8[1] = (byte)((uint)iVar4 >> 8);
    }
    s->available_out_ = s->available_out_ + (ulong)(bVar1 + 0xd >> 3);
    iVar4 = 1;
  }
  else {
    uVar3 = s->available_out_;
    iVar4 = 0;
    if ((uVar3 != 0) && (__n = *available_out, __n != 0)) {
      if (uVar3 < __n) {
        __n = uVar3;
      }
      memcpy(*next_out,s->next_out_,__n);
      *next_out = *next_out + __n;
      *available_out = *available_out - __n;
      s->next_out_ = s->next_out_ + __n;
      s->available_out_ = s->available_out_ - __n;
      sVar6 = __n + s->total_out_;
      s->total_out_ = sVar6;
      iVar4 = 1;
      if (total_out != (size_t *)0x0) {
        *total_out = sVar6;
      }
    }
  }
  return iVar4;
}

Assistant:

static BROTLI_BOOL InjectFlushOrPushOutput(BrotliEncoderState* s,
    size_t* available_out, uint8_t** next_out, size_t* total_out) {
  if (s->stream_state_ == BROTLI_STREAM_FLUSH_REQUESTED &&
      s->last_byte_bits_ != 0) {
    InjectBytePaddingBlock(s);
    return BROTLI_TRUE;
  }

  if (s->available_out_ != 0 && *available_out != 0) {
    size_t copy_output_size =
        BROTLI_MIN(size_t, s->available_out_, *available_out);
    memcpy(*next_out, s->next_out_, copy_output_size);
    *next_out += copy_output_size;
    *available_out -= copy_output_size;
    s->next_out_ += copy_output_size;
    s->available_out_ -= copy_output_size;
    s->total_out_ += copy_output_size;
    if (total_out) *total_out = s->total_out_;
    return BROTLI_TRUE;
  }

  return BROTLI_FALSE;
}